

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void reportLpColMatrix(HighsLogOptions *log_options,HighsLp *lp)

{
  HighsInt *pHVar1;
  string *this;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (0 < lp->num_col_) {
    if (lp->num_row_ == 0) {
      std::__cxx11::string::string((string *)&local_50,"Column",&local_51);
      pHVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      reportMatrix(log_options,&local_50,lp->num_col_,pHVar1[lp->num_col_],pHVar1,(HighsInt *)0x0,
                   (double *)0x0);
      this = &local_50;
    }
    else {
      std::__cxx11::string::string((string *)&local_30,"Column",&local_51);
      pHVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      reportMatrix(log_options,&local_30,lp->num_col_,pHVar1[lp->num_col_],pHVar1,
                   (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      this = &local_30;
    }
    std::__cxx11::string::~string((string *)this);
  }
  return;
}

Assistant:

void reportLpColMatrix(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_col_ <= 0) return;
  if (lp.num_row_) {
    // With positive number of rows, can assume that there are index and value
    // vectors to pass
    reportMatrix(log_options, "Column", lp.num_col_,
                 lp.a_matrix_.start_[lp.num_col_], lp.a_matrix_.start_.data(),
                 lp.a_matrix_.index_.data(), lp.a_matrix_.value_.data());
  } else {
    // With no rows, can's assume that there are index and value vectors to pass
    reportMatrix(log_options, "Column", lp.num_col_,
                 lp.a_matrix_.start_[lp.num_col_], lp.a_matrix_.start_.data(),
                 NULL, NULL);
  }
}